

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

void ImageColorContrast(Image *image,float contrast)

{
  int newFormat;
  Color *pCVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Image in_stack_00000000;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    pCVar1 = LoadImageColors(in_stack_00000000);
    if (0 < image->height * image->width) {
      fVar4 = -100.0;
      if (-100.0 <= contrast) {
        fVar4 = contrast;
      }
      fVar3 = 100.0;
      if (fVar4 <= 100.0) {
        fVar3 = fVar4;
      }
      fVar4 = (fVar3 + 100.0) / 100.0;
      fVar4 = fVar4 * fVar4;
      lVar2 = 0;
      do {
        fVar5 = (((float)pCVar1[lVar2].r / 255.0 + -0.5) * fVar4 + 0.5) * 255.0;
        fVar3 = 0.0;
        if (0.0 <= fVar5) {
          fVar3 = fVar5;
        }
        fVar5 = 255.0;
        if (fVar3 <= 255.0) {
          fVar5 = fVar3;
        }
        fVar6 = (((float)pCVar1[lVar2].g / 255.0 + -0.5) * fVar4 + 0.5) * 255.0;
        fVar3 = 0.0;
        if (0.0 <= fVar6) {
          fVar3 = fVar6;
        }
        fVar6 = 255.0;
        if (fVar3 <= 255.0) {
          fVar6 = fVar3;
        }
        fVar7 = (((float)pCVar1[lVar2].b / 255.0 + -0.5) * fVar4 + 0.5) * 255.0;
        fVar3 = 0.0;
        if (0.0 <= fVar7) {
          fVar3 = fVar7;
        }
        fVar7 = 255.0;
        if (fVar3 <= 255.0) {
          fVar7 = fVar3;
        }
        pCVar1[lVar2].r = (uchar)(int)fVar5;
        pCVar1[lVar2].g = (uchar)(int)fVar6;
        pCVar1[lVar2].b = (uchar)(int)fVar7;
        lVar2 = lVar2 + 1;
      } while (lVar2 < (long)image->height * (long)image->width);
    }
    newFormat = image->format;
    free(image->data);
    image->data = pCVar1;
    image->format = 7;
    ImageFormat(image,newFormat);
    return;
  }
  return;
}

Assistant:

void ImageColorContrast(Image *image, float contrast)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (contrast < -100) contrast = -100;
    if (contrast > 100) contrast = 100;

    contrast = (100.0f + contrast)/100.0f;
    contrast *= contrast;

    Color *pixels = LoadImageColors(*image);

    for (int i = 0; i < image->width*image->height; i++)
    {
        float pR = (float)pixels[i].r/255.0f;
        pR -= 0.5f;
        pR *= contrast;
        pR += 0.5f;
        pR *= 255;
        if (pR < 0) pR = 0;
        if (pR > 255) pR = 255;

        float pG = (float)pixels[i].g/255.0f;
        pG -= 0.5f;
        pG *= contrast;
        pG += 0.5f;
        pG *= 255;
        if (pG < 0) pG = 0;
        if (pG > 255) pG = 255;

        float pB = (float)pixels[i].b/255.0f;
        pB -= 0.5f;
        pB *= contrast;
        pB += 0.5f;
        pB *= 255;
        if (pB < 0) pB = 0;
        if (pB > 255) pB = 255;

        pixels[i].r = (unsigned char)pR;
        pixels[i].g = (unsigned char)pG;
        pixels[i].b = (unsigned char)pB;
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}